

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaemonClient.cpp
# Opt level: O3

int64_t __thiscall xmrig::DaemonClient::submit(DaemonClient *this,JobResult *result)

{
  uint32_t uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  int64_t iVar4;
  bool bVar5;
  mapped_type *pmVar6;
  int __flags;
  long lVar7;
  Value params;
  Document doc;
  Data local_b8;
  uint64_t local_a8;
  String local_a0;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  local_90;
  
  bVar5 = String::isEqual(&result->jobId,
                          (this->m_blocktemplate).m_data + ((this->m_blocktemplate).m_size - 0x20));
  lVar7 = -1;
  if (bVar5) {
    Buffer::toHex((uint8_t *)&result->nonce,4,(uint8_t *)((this->m_blocktemplate).m_data + 0x4e));
    __flags = 0;
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::GenericDocument(&local_90,kObjectType,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,
                      0x400,(CrtAllocator *)0x0);
    local_b8.n = (Number)0x0;
    local_b8.s.str = (Ch *)0x4000000000000;
    String::toJSON(&local_a0);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_b8.s,
             (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_a0,local_90.allocator_);
    JsonRequest::create(&local_90,BaseClient::m_sequence,"submitblock",(Value *)&local_b8.s);
    iVar4 = BaseClient::m_sequence;
    local_a8 = result->diff;
    uVar2 = *(ulong *)(result->m_result + 0x18);
    uVar1 = result->backend;
    lVar7 = std::chrono::_V2::steady_clock::now();
    pmVar6 = std::
             map<long,_xmrig::SubmitResult,_std::less<long>,_std::allocator<std::pair<const_long,_xmrig::SubmitResult>_>_>
             ::operator[](&(this->super_BaseClient).m_results,&BaseClient::m_sequence);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar2;
    pmVar6->reqId = 0;
    pmVar6->seq = iVar4;
    pmVar6->backend = uVar1;
    pmVar6->actualDiff = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar3,0);
    pmVar6->diff = local_a8;
    pmVar6->elapsed = 0;
    pmVar6->m_start = lVar7 / 1000000;
    send(this,3,"/json_rpc",(size_t)&local_90,__flags);
    lVar7 = BaseClient::m_sequence;
    BaseClient::m_sequence = BaseClient::m_sequence + 1;
    rapidjson::
    GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
    ::~GenericDocument(&local_90);
  }
  return lVar7;
}

Assistant:

int64_t xmrig::DaemonClient::submit(const JobResult &result)
{
    if (result.jobId != (m_blocktemplate.data() + m_blocktemplate.size() - 32)) {
        return -1;
    }

    Buffer::toHex(reinterpret_cast<const uint8_t *>(&result.nonce), 4, m_blocktemplate.data() + 78);

    using namespace rapidjson;
    Document doc(kObjectType);

    Value params(kArrayType);
    params.PushBack(m_blocktemplate.toJSON(), doc.GetAllocator());

    JsonRequest::create(doc, m_sequence, "submitblock", params);

    m_results[m_sequence] = SubmitResult(m_sequence, result.diff, result.actualDiff(), 0, result.backend);

    send(HTTP_POST, kJsonRPC, doc);

    return m_sequence++;
}